

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SWDSimulationDataGenerator.cpp
# Opt level: O0

U32 __thiscall
SWDSimulationDataGenerator::GenerateSimulationData
          (SWDSimulationDataGenerator *this,U64 largest_sample_requested,U32 sample_rate,
          SimulationChannelDescriptor **simulation_channels)

{
  uint uVar1;
  bool is_write_00;
  U32 UVar2;
  ulong uVar3;
  ulong uVar4;
  SimulationChannelDescriptor *pSVar5;
  bool is_write;
  SimulationData *sim;
  U64 adjusted_largest_sample_requested;
  SimulationChannelDescriptor **simulation_channels_local;
  U32 sample_rate_local;
  U64 largest_sample_requested_local;
  SWDSimulationDataGenerator *this_local;
  
  uVar3 = AnalyzerHelpers::AdjustSimulationTargetSample
                    (largest_sample_requested,sample_rate,this->mSimulationSampleRateHz);
  while (uVar4 = SimulationChannelDescriptor::GetCurrentSampleNumber(), uVar4 < uVar3) {
    if (simul_data[this->mSimulCnt].request == '\0') {
      AdvanceAllBySec(this,0.01);
      OutputLineReset(this);
      this->mSimulCnt = 0;
    }
    uVar1 = this->mSimulCnt;
    is_write_00 = OutputRequest(this,simul_data[uVar1].request,'\x01',
                                (uint)((simul_data[uVar1].data & 1) != 0));
    OutputData(this,simul_data[uVar1].data,is_write_00);
    this->mSimulCnt = this->mSimulCnt + 1;
    if (simul_data[this->mSimulCnt].request == '\0') {
      OutputRequest(this,0xa5,'\x04',BIT_HIGH);
      AdvanceAllBySec(this,9.999999999999999e-06);
      OutputRequest(this,0xb1,'\x02',BIT_LOW);
      AdvanceAllBySec(this,9.999999999999999e-06);
    }
  }
  pSVar5 = (SimulationChannelDescriptor *)SimulationChannelDescriptorGroup::GetArray();
  *simulation_channels = pSVar5;
  UVar2 = SimulationChannelDescriptorGroup::GetCount();
  return UVar2;
}

Assistant:

U32 SWDSimulationDataGenerator::GenerateSimulationData( U64 largest_sample_requested, U32 sample_rate,
                                                        SimulationChannelDescriptor** simulation_channels )
{
    U64 adjusted_largest_sample_requested =
        AnalyzerHelpers::AdjustSimulationTargetSample( largest_sample_requested, sample_rate, mSimulationSampleRateHz );

    // while the caller needs more samples
    while( mSWCLK->GetCurrentSampleNumber() < adjusted_largest_sample_requested )
    {
        // if we've reached the end of the array of data
        if( simul_data[ mSimulCnt ].request == 0 )
        {
            // pause, reset and restart the data
            AdvanceAllBySec( 0.01 );
            OutputLineReset();
            mSimulCnt = 0;
        }

        // shortcut to the simulated data object
        const SimulationData& sim( simul_data[ mSimulCnt ] );

        // the request and ACK with turnarounds
        // we need the first data bit to prepare the data line
        bool is_write = OutputRequest( sim.request, ACK_OK, ( sim.data & 1 ) ? BIT_HIGH : BIT_LOW );
        OutputData( sim.data, is_write ); // the WData part with parity

        mSimulCnt++;

        // have we reached the end of the data?
        if( simul_data[ mSimulCnt ].request == 0 )
        {
            // show a fault and wait response
            OutputRequest( 0xA5, ACK_FAULT, BIT_HIGH );
            AdvanceAllBySec( TENTH_US * 100 );
            OutputRequest( 0xB1, ACK_WAIT, BIT_LOW );
            AdvanceAllBySec( TENTH_US * 100 );
        }
    }

    *simulation_channels = mSWDSimulationChannels.GetArray();

    return mSWDSimulationChannels.GetCount();
}